

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtin_functions.cpp
# Opt level: O1

ir_function_signature * __thiscall
anon_unknown.dwarf_e4c90::builtin_builder::_EmitStreamVertex
          (builtin_builder *this,builtin_available_predicate avail,glsl_type *stream_type)

{
  void *mem_ctx;
  ir_variable *this_00;
  ir_function_signature *piVar1;
  ir_instruction *ir;
  ir_dereference_variable *this_01;
  ir_factory body;
  ir_factory local_38;
  
  this_00 = (ir_variable *)exec_node::operator_new(0x90,builtins.mem_ctx);
  ir_variable::ir_variable(this_00,(glsl_type *)this,"stream",ir_var_const_in);
  piVar1 = new_sig(&builtins,&glsl_type::_void_type,gs_streams,1,this_00);
  mem_ctx = builtins.mem_ctx;
  local_38.instructions = &piVar1->body;
  local_38.mem_ctx = builtins.mem_ctx;
  piVar1->field_0x48 = piVar1->field_0x48 | 1;
  ir = (ir_instruction *)exec_node::operator_new(0x28,mem_ctx);
  this_01 = (ir_dereference_variable *)exec_node::operator_new(0x30,builtins.mem_ctx);
  ir_dereference_variable::ir_dereference_variable(this_01,this_00);
  (ir->super_exec_node).next = (exec_node *)0x0;
  (ir->super_exec_node).prev = (exec_node *)0x0;
  ir->ir_type = ir_type_emit_vertex;
  ir->_vptr_ir_instruction = (_func_int **)&PTR__ir_instruction_00262d78;
  ir[1]._vptr_ir_instruction = (_func_int **)this_01;
  ir_builder::ir_factory::emit(&local_38,ir);
  return piVar1;
}

Assistant:

ir_function_signature *
builtin_builder::_EmitStreamVertex(builtin_available_predicate avail,
                                   const glsl_type *stream_type)
{
   /* Section 8.12 (Geometry Shader Functions) of the GLSL 4.0 spec says:
    *
    *     "Emit the current values of output variables to the current output
    *     primitive on stream stream. The argument to stream must be a constant
    *     integral expression."
    */
   ir_variable *stream =
      new(mem_ctx) ir_variable(stream_type, "stream", ir_var_const_in);

   MAKE_SIG(glsl_type::void_type, avail, 1, stream);

   body.emit(new(mem_ctx) ir_emit_vertex(var_ref(stream)));

   return sig;
}